

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_template.hpp
# Opt level: O2

bool __thiscall
boost::detail::function::
basic_vtable2<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
::assign_to<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>>
          (basic_vtable2<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
           *this,token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *f,undefined8 functor)

{
  token_finderF<boost::algorithm::detail::is_any_ofF<char>_> tStack_38;
  
  algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>_>::token_finderF
            (&tStack_38,f);
  assign_functor<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>>
            (this,&tStack_38,functor);
  algorithm::detail::is_any_ofF<char>::~is_any_ofF(&tStack_38.m_Pred);
  return true;
}

Assistant:

bool 
        assign_to(FunctionObj f, function_buffer& functor, function_obj_tag) const
        {
          if (!boost::detail::function::has_empty_target(boost::addressof(f))) {
            assign_functor(f, functor, 
                           mpl::bool_<(function_allows_small_object_optimization<FunctionObj>::value)>());
            return true;
          } else {
            return false;
          }
        }